

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O0

void msd_CE6(uchar **strings,size_t n,size_t depth,uint16_t *oracle,uchar **sorted)

{
  uchar *puVar1;
  size_t sVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  size_t *__ptr;
  ulong local_80;
  size_t i_4;
  size_t bsum;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t *bucketsize;
  uint16_t ch2;
  uint16_t ch1;
  uchar *str2;
  uchar *str1;
  size_t i;
  uchar **sorted_local;
  uint16_t *oracle_local;
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x10000) {
    msd_CE2_16bit_5(strings,n,depth,(uchar *)oracle,sorted);
  }
  else {
    for (str1 = (uchar *)0x0; str1 < (uchar *)(n - (n & 1)); str1 = str1 + 2) {
      puVar1 = strings[(long)(str1 + 1)];
      uVar3 = get_char<unsigned_short>(strings[(long)str1],depth);
      uVar4 = get_char<unsigned_short>(puVar1,depth);
      oracle[(long)str1] = uVar3;
      oracle[(long)(str1 + 1)] = uVar4;
    }
    for (; str1 < n; str1 = str1 + 1) {
      uVar3 = get_char<unsigned_short>(strings[(long)str1],depth);
      oracle[(long)str1] = uVar3;
    }
    __ptr = (size_t *)calloc(0x10000,8);
    for (i_2 = 0; i_2 < n; i_2 = i_2 + 1) {
      __ptr[oracle[i_2]] = __ptr[oracle[i_2]] + 1;
    }
    msd_CE6::bucketindex[0] = 0;
    for (i_3 = 1; i_3 < 0x10000; i_3 = i_3 + 1) {
      msd_CE6::bucketindex[i_3] = msd_CE6::bucketindex[i_3 - 1] + __ptr[i_3 - 1];
    }
    for (bsum = 0; bsum < n; bsum = bsum + 1) {
      puVar1 = strings[bsum];
      sVar2 = msd_CE6::bucketindex[oracle[bsum]];
      msd_CE6::bucketindex[oracle[bsum]] = sVar2 + 1;
      sorted[sVar2] = puVar1;
    }
    memcpy(strings,sorted,n << 3);
    i_4 = *__ptr;
    for (local_80 = 1; local_80 < 0x10000; local_80 = local_80 + 1) {
      if (__ptr[local_80] != 0) {
        if ((local_80 & 0xff) != 0) {
          msd_CE6(strings + i_4,__ptr[local_80],depth + 2,oracle,sorted);
        }
        i_4 = __ptr[local_80] + i_4;
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void
msd_CE6(unsigned char** strings, size_t n, size_t depth,
		uint16_t* oracle, unsigned char** sorted)
{
	if (n < 0x10000) {
		msd_CE2_16bit_5(strings, n, depth, (unsigned char*)oracle, sorted);
		return;
	}
	{
		size_t i;
		for (i=0; i < n-n%2; i+=2) {
			unsigned char* str1 = strings[i];
			unsigned char* str2 = strings[i+1];
			uint16_t ch1 = get_char<uint16_t>(str1, depth);
			uint16_t ch2 = get_char<uint16_t>(str2, depth);
			oracle[i] = ch1;
			oracle[i+1] = ch2;
		}
		for (; i < n; ++i)
			oracle[i] = get_char<uint16_t>(strings[i], depth);
	}
	size_t* restrict bucketsize = (size_t*)
		calloc(0x10000, sizeof(size_t));
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	static size_t bucketindex[0x10000];
	bucketindex[0] = 0;
	for (size_t i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_CE6(strings+bsum, bucketsize[i],
				depth+2, oracle, sorted);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}